

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,LambdaNode *node)

{
  value_type vVar1;
  bool bVar2;
  BlockNode *pBVar3;
  reference pvVar4;
  TypeName *pTVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  LambdaNode *in_RSI;
  SymbolTable *in_RDI;
  Node *in_stack_00000068;
  string *in_stack_00000070;
  value_type returnInfo;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
  *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *__range1;
  value_type *in_stack_fffffffffffffe68;
  stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
  *in_stack_fffffffffffffe70;
  unique_ptr<VariableSymbol,_std::default_delete<VariableSymbol>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  TypeName TVar6;
  TypeName *in_stack_fffffffffffffe90;
  allocator<char> *in_stack_fffffffffffffea0;
  reference in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  size_t *__lhs_00;
  unique_ptr<Symbol,_std::default_delete<Symbol>_> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  _Self local_30;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *local_28;
  LambdaNode *local_10;
  
  __lhs_00 = &in_RDI[1].scopes_.
              super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
  local_10 = in_RSI;
  ReturnInfo::ReturnInfo((ReturnInfo *)0x17b9ea);
  std::
  stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
  ::push(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  SymbolTable::enterScope(in_RDI);
  local_28 = LambdaNode::getArguments_abi_cxx11_(local_10);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
       ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                *)in_stack_fffffffffffffe68);
  local_40._8_8_ =
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
       ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)in_stack_fffffffffffffe68);
  while (bVar2 = std::operator!=(&local_30,(_Self *)(local_40 + 8)), bVar2) {
    in_stack_fffffffffffffea8 =
         std::
         _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
         ::operator*((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                      *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffea0 =
         (allocator<char> *)
         &(in_RDI->scopes_).
          super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size;
    local_40._0_8_ = in_stack_fffffffffffffea8;
    std::make_unique<VariableSymbol,std::__cxx11::string_const&,TypeName_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               in_stack_fffffffffffffe90);
    in_stack_fffffffffffffeb0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_50 + 8);
    std::unique_ptr<Symbol,std::default_delete<Symbol>>::
    unique_ptr<VariableSymbol,std::default_delete<VariableSymbol>,void>
              ((unique_ptr<Symbol,_std::default_delete<Symbol>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    SymbolTable::addSymbol
              ((SymbolTable *)in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0);
    std::unique_ptr<Symbol,_std::default_delete<Symbol>_>::~unique_ptr
              ((unique_ptr<Symbol,_std::default_delete<Symbol>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    std::unique_ptr<VariableSymbol,_std::default_delete<VariableSymbol>_>::~unique_ptr
              ((unique_ptr<VariableSymbol,_std::default_delete<VariableSymbol>_> *)
               in_stack_fffffffffffffe70);
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
    ::operator++(&local_30);
  }
  pBVar3 = LambdaNode::getBody((LambdaNode *)0x17bb4c);
  (*(pBVar3->super_StatementNode).super_Node._vptr_Node[2])(pBVar3,in_RDI);
  SymbolTable::leaveScope((SymbolTable *)0x17bb68);
  pvVar4 = std::
           stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
           ::top((stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
                  *)0x17bb76);
  vVar1 = *pvVar4;
  std::
  stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
  ::pop((stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
         *)0x17bb99);
  pTVar5 = LambdaNode::getReturnType(local_10);
  if ((*pTVar5 != Void) &&
     (((undefined1  [12])vVar1 & (undefined1  [12])0x1) == (undefined1  [12])0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
              );
    reportError(in_stack_00000070,in_stack_00000068);
  }
  pTVar5 = LambdaNode::getReturnType(local_10);
  if ((*pTVar5 == Void) &&
     (((undefined1  [12])vVar1 & (undefined1  [12])0x1) != (undefined1  [12])0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
              );
    reportError(in_stack_00000070,in_stack_00000068);
  }
  pTVar5 = LambdaNode::getReturnType(local_10);
  if ((*pTVar5 != Void) &&
     (bVar2 = std::optional<TypeName>::has_value((optional<TypeName> *)0x17bd22), bVar2)) {
    pTVar5 = LambdaNode::getReturnType(local_10);
    TVar6 = *pTVar5;
    pTVar5 = std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffe70);
    if (TVar6 != *pTVar5) {
      LambdaNode::getReturnType(local_10);
      std::
      unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffffe70,(key_type *)in_stack_fffffffffffffe68);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xfffffffffffffec8;
      std::operator+((char *)__lhs_00,in_stack_fffffffffffffeb0);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffe70);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffe70);
      std::
      unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)__rhs,(key_type *)in_stack_fffffffffffffe68);
      std::operator+(__lhs,__rhs);
      std::operator+(__lhs,(char *)__rhs);
      reportError(in_stack_00000070,in_stack_00000068);
    }
  }
  return;
}

Assistant:

void SemanticAnalyser::visit(const LambdaNode& node) 
{
  hasReturn_.push({});
  symbols_.enterScope();

  for(const auto& arg : node.getArguments())
  {
    symbols_.addSymbol(arg.first, std::make_unique<VariableSymbol>(arg.first, arg.second));
  }

  node.getBody().accept(*this);

  symbols_.leaveScope();
  const auto returnInfo = hasReturn_.top();
  hasReturn_.pop();

  if(node.getReturnType() != TypeName::Void && !returnInfo.hasReturn)
    reportError("Lambda does not return any value!", node);
  else if(node.getReturnType() == TypeName::Void && returnInfo.hasReturn)
    reportError("Void lambda does return!", node);
  else if(node.getReturnType() != TypeName::Void && 
    returnInfo.type.has_value() && node.getReturnType() != returnInfo.type.value())
    reportError("Lambda should return " + 
      TypeNameStrings.at(node.getReturnType()) + ", but returns " + 
        TypeNameStrings.at(returnInfo.type.value()) + "!", node);
}